

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::clear(Net *this)

{
  uint uVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  pointer poVar5;
  pointer pcVar6;
  layer_destroyer_func p_Var7;
  code *pcVar8;
  int iVar9;
  NetPrivate *pNVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  pointer poVar14;
  Option opt1;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear(&this->d->blobs);
  uVar12 = 0;
  do {
    pNVar10 = this->d;
    ppLVar2 = (pNVar10->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar3 = (pNVar10->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppLVar3 - (long)ppLVar2 >> 3) <= uVar12) {
      if (ppLVar3 != ppLVar2) {
        (pNVar10->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppLVar2;
      }
      if (pNVar10->local_blob_allocator != (PoolAllocator *)0x0) {
        (*(pNVar10->local_blob_allocator->super_Allocator)._vptr_Allocator[1])();
        pNVar10 = this->d;
        pNVar10->local_blob_allocator = (PoolAllocator *)0x0;
      }
      if (pNVar10->local_workspace_allocator != (PoolAllocator *)0x0) {
        (*(pNVar10->local_workspace_allocator->super_Allocator)._vptr_Allocator[1])();
        this->d->local_workspace_allocator = (PoolAllocator *)0x0;
      }
      return;
    }
    pLVar4 = ppLVar2[uVar12];
    get_masked_option(&opt1,&this->opt,pLVar4->featmask);
    iVar9 = (*pLVar4->_vptr_Layer[5])(pLVar4,&opt1);
    if (iVar9 != 0) {
      fwrite("layer destroy_pipeline failed",0x1d,1,_stderr);
      fputc(10,_stderr);
    }
    uVar1 = pLVar4->typeindex;
    if ((uVar1 >> 8 & 1) == 0) {
      poVar5 = (this->d->overwrite_builtin_layer_registry).
               super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      poVar14 = poVar5;
      for (lVar13 = 0;
          (long)(this->d->overwrite_builtin_layer_registry).
                super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar5 >> 5 != lVar13;
          lVar13 = lVar13 + 1) {
        if (poVar14->typeindex == uVar1) {
          if ((int)lVar13 != -1) {
            pcVar8 = *(code **)((long)&poVar5->destroyer + (lVar11 >> 0x1b));
            if (pcVar8 != (code *)0x0) {
              (*pcVar8)(pLVar4,*(undefined8 *)((long)&poVar5->userdata + (lVar11 >> 0x1b)));
              goto LAB_00185849;
            }
          }
          break;
        }
        lVar11 = lVar11 + 0x100000000;
        poVar14 = poVar14 + 1;
      }
LAB_0018583f:
      (*pLVar4->_vptr_Layer[1])(pLVar4);
    }
    else {
      pcVar6 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var7 = pcVar6[(long)(int)uVar1 & 0x7fffffffffffeffU].destroyer;
      if (p_Var7 == (layer_destroyer_func)0x0) goto LAB_0018583f;
      (*p_Var7)(pLVar4,pcVar6[(long)(int)uVar1 & 0x7fffffffffffeffU].userdata);
    }
LAB_00185849:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            // check overwrite builtin layer destroyer
            int index = -1;
            const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
            for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
            {
                if (d->overwrite_builtin_layer_registry[i].typeindex == layer->typeindex)
                {
                    index = i;
                    break;
                }
            }

            if (index != -1 && d->overwrite_builtin_layer_registry[index].destroyer)
            {
                d->overwrite_builtin_layer_registry[index].destroyer(layer, d->overwrite_builtin_layer_registry[index].userdata);
            }
            else
            {
                delete layer;
            }
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}